

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O0

void NES_APU_np_Reset(void *chip)

{
  int local_1c;
  int i;
  NES_APU *apu;
  void *chip_local;
  
  *(undefined4 *)((long)chip + 0x30) = 0;
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0xe8) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0xf0) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0xf8) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x100) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x108) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x110) = 0;
    *(undefined1 *)((long)chip + (long)local_1c + 0x118) = 0;
    *(undefined1 *)((long)chip + (long)local_1c + 0x11a) = 0;
    *(undefined1 *)((long)chip + (long)local_1c + 0x11c) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x120) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x128) = 1;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x130) = 0;
    *(undefined1 *)((long)chip + (long)local_1c + 0x138) = 0;
    *(undefined1 *)((long)chip + (long)local_1c + 0x13a) = 0;
    *(undefined1 *)((long)chip + (long)local_1c + 0x13c) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x140) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x148) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x150) = 0;
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x158) = 0;
    *(undefined1 *)((long)chip + (long)local_1c + 0x160) = 0;
  }
  for (local_1c = 0x4000; local_1c < 0x4008; local_1c = local_1c + 1) {
    NES_APU_np_Write(chip,(UINT16)local_1c,'\0');
  }
  NES_APU_np_Write(chip,0x4015,'\0');
  if (*(int *)((long)chip + 8) != 0) {
    NES_APU_np_Write(chip,0x4015,'\x0f');
  }
  if (*(int *)((long)chip + 0x18) != 0) {
    NES_APU_np_Write(chip,0x4001,'\b');
    NES_APU_np_Write(chip,0x4005,'\b');
  }
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    *(undefined4 *)((long)chip + (long)local_1c * 4 + 0x54) = 0;
  }
  NES_APU_np_SetRate(chip,*(UINT32 *)((long)chip + 0x5c));
  RC_RESET((RATIO_CNTR *)((long)chip + 0x168));
  return;
}

Assistant:

void NES_APU_np_Reset(void* chip)
{
	NES_APU* apu = (NES_APU*)chip;
	int i;
	apu->gclock = 0;
	//apu->mask = 0;

	for (i=0; i<2; ++i)
	{
		apu->scounter[i] = 0;
		apu->sphase[i] = 0;
		apu->duty[i] = 0;
		apu->volume[i] = 0;
		apu->freq[i] = 0;
		apu->sfreq[i] = 0;
		apu->sweep_enable[i] = 0;
		apu->sweep_mode[i] = 0;
		apu->sweep_write[i] = 0;
		apu->sweep_div_period[i] = 0;
		apu->sweep_div[i] = 1;
		apu->sweep_amount[i] = 0;
		apu->envelope_disable[i] = 0;
		apu->envelope_loop[i] = 0;
		apu->envelope_write[i] = 0;
		apu->envelope_div_period[i] = 0;
		apu->envelope_div[i] = 0;
		apu->envelope_counter[i] = 0;
		apu->length_counter[i] = 0;
		apu->enable[i] = 0;
	}

	for (i = 0x4000; i < 0x4008; i++)
		NES_APU_np_Write(apu, i, 0);

	NES_APU_np_Write(apu, 0x4015, 0);
	if (apu->option[OPT_UNMUTE_ON_RESET])
		NES_APU_np_Write(apu, 0x4015, 0x0f);
	if (apu->option[OPT_NEGATE_SWEEP_INIT])
	{
		NES_APU_np_Write(apu, 0x4001, 0x08);
		NES_APU_np_Write(apu, 0x4005, 0x08);
	}

	for (i = 0; i < 2; i++)
		apu->out[i] = 0;

	NES_APU_np_SetRate(apu, apu->rate);
	RC_RESET(&apu->tick_count);
}